

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

NodeId __thiscall
optimization::common_expr_del::BlockNodes::add_leaf_node(BlockNodes *this,Value *val)

{
  size_type sVar1;
  char *pcVar2;
  mapped_type *pmVar3;
  int __c;
  key_type *in_RSI;
  long in_RDI;
  shared_ptr<optimization::common_expr_del::Node> node;
  size_type id;
  NodeId nodeId;
  Value *in_stack_ffffffffffffff88;
  optional<mir::inst::Value> *in_stack_ffffffffffffff90;
  key_type *__k;
  NodeId in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint32_t local_20;
  NodeId local_4;
  
  sVar1 = std::
          vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
          ::size((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
                  *)(in_RDI + 8));
  local_20 = (uint32_t)sVar1;
  NodeId::NodeId(&local_4,local_20);
  std::make_shared<optimization::common_expr_del::Node>();
  std::
  __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16a6c8);
  __k = in_RSI;
  std::optional<mir::inst::Value>::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  pcVar2 = std::variant<int,_mir::inst::VarId>::index
                     ((variant<int,_mir::inst::VarId> *)
                      &(__k->operands).
                       super__Vector_base<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,(char *)in_RSI,__c);
  if (pcVar2 == (char *)0x1) {
    std::get<mir::inst::VarId,int,mir::inst::VarId>((variant<int,_mir::inst::VarId> *)0x16a70b);
    in_stack_ffffffffffffff90 =
         (optional<mir::inst::Value> *)
         std::
         map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
         ::operator[]((map<mir::inst::VarId,_optimization::common_expr_del::NodeId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_optimization::common_expr_del::NodeId>_>_>
                       *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0.id),
                      (key_type *)__k);
    *(uint32_t *)
     &(in_stack_ffffffffffffff90->super__Optional_base<mir::inst::Value,_false,_false>)._M_payload.
      super__Optional_payload_base<mir::inst::Value>._M_payload = local_4.id;
  }
  std::
  vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
  ::push_back((vector<std::shared_ptr<optimization::common_expr_del::Node>,_std::allocator<std::shared_ptr<optimization::common_expr_del::Node>_>_>
               *)in_stack_ffffffffffffff90,(value_type *)in_stack_ffffffffffffff88);
  NodeId::NodeId((NodeId *)&stack0xffffffffffffffc0,local_20);
  std::
  __shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator*((__shared_ptr_access<optimization::common_expr_del::Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)(in_RDI + 0x50));
  pmVar3 = std::
           map<optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::Node>,_std::allocator<std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>_>_>
           ::operator[]((map<optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::Node>,_std::allocator<std::pair<const_optimization::common_expr_del::Node,_optimization::common_expr_del::NodeId>_>_>
                         *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0.id),__k);
  pmVar3->id = in_stack_ffffffffffffffc0.id;
  std::shared_ptr<optimization::common_expr_del::Node>::~shared_ptr
            ((shared_ptr<optimization::common_expr_del::Node> *)0x16a7b8);
  return (NodeId)local_4.id;
}

Assistant:

NodeId add_leaf_node(mir::inst::Value val) {
    auto id = nodes.size();
    NodeId nodeId(id);
    auto node = std::make_shared<Node>();
    node->value = val;
    if (val.index() == 1) {
      var_map[std::get<mir::inst::VarId>(val)] = nodeId;
    }
    nodes.push_back(node);
    node_map[*node] = id;
    return nodeId;
  }